

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

double __thiscall
util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
          (BasicVector<Vector2,_double,_2UL> *this,int b)

{
  ostream *poVar1;
  double *pdVar2;
  S2LogMessage local_50;
  S2LogMessageVoidify local_3d [20];
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  int local_14;
  BasicVector<Vector2,_double,_2UL> *pBStack_10;
  int b_local;
  BasicVector<Vector2,_double,_2UL> *this_local;
  
  local_29 = 0;
  local_14 = b;
  pBStack_10 = this;
  if (b < 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/vector.h"
               ,0x59,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar1 = S2LogMessage::stream(&local_28);
    poVar1 = std::operator<<(poVar1,"Check failed: (b) >= (0) ");
    S2LogMessageVoidify::operator&(&local_15,poVar1);
  }
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  if (1 < local_14) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/vector.h"
               ,0x5a,kFatal,(ostream *)&std::cerr);
    poVar1 = S2LogMessage::stream(&local_50);
    poVar1 = std::operator<<(poVar1,"Check failed: (b) < (SIZE) ");
    S2LogMessageVoidify::operator&(local_3d,poVar1);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
  }
  pdVar2 = Vector2<double>::Data((Vector2<double> *)this);
  return pdVar2[local_14];
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }